

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t roaring_bitmap_rank(roaring_bitmap_t *bm,uint32_t x)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    if ((bm->high_low_container).size <= lVar4) {
      return uVar3;
    }
    uVar1 = (uint)(bm->high_low_container).keys[lVar4];
    if (x >> 0x10 <= uVar1) break;
    iVar2 = container_get_cardinality
                      ((bm->high_low_container).containers[lVar4],
                       (bm->high_low_container).typecodes[lVar4]);
    uVar3 = uVar3 + (long)iVar2;
    lVar4 = lVar4 + 1;
  }
  if (x >> 0x10 != uVar1) {
    return uVar3;
  }
  iVar2 = container_rank((bm->high_low_container).containers[lVar4],
                         (bm->high_low_container).typecodes[lVar4],(uint16_t)x);
  return uVar3 + (long)iVar2;
}

Assistant:

uint64_t roaring_bitmap_rank(const roaring_bitmap_t *bm, uint32_t x) {
    uint64_t size = 0;
    uint32_t xhigh = x >> 16;
    for (int i = 0; i < bm->high_low_container.size; i++) {
        uint32_t key = bm->high_low_container.keys[i];
        if (xhigh > key) {
            size +=
                container_get_cardinality(bm->high_low_container.containers[i],
                                          bm->high_low_container.typecodes[i]);
        } else if (xhigh == key) {
            return size + container_rank(bm->high_low_container.containers[i],
                                         bm->high_low_container.typecodes[i],
                                         x & 0xFFFF);
        } else {
            return size;
        }
    }
    return size;
}